

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O3

void __thiscall xr_entity_factory::~xr_entity_factory(xr_entity_factory *this)

{
  xr_ini_file *this_00;
  pointer ppfVar1;
  pointer ppfVar2;
  
  this_00 = this->m_system_ini;
  if (this_00 != (xr_ini_file *)0x0) {
    xray_re::xr_ini_file::~xr_ini_file(this_00);
  }
  operator_delete(this_00,0x18);
  ppfVar2 = (this->m_clsids).
            super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppfVar1 = (this->m_clsids).
            super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppfVar2 != ppfVar1) {
    do {
      if (*ppfVar2 != (factory_item_base *)0x0) {
        (*(*ppfVar2)->_vptr_factory_item_base[1])();
      }
      ppfVar2 = ppfVar2 + 1;
    } while (ppfVar2 != ppfVar1);
    ppfVar2 = (this->m_clsids).
              super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppfVar2 != (pointer)0x0) {
    operator_delete(ppfVar2,(long)(this->m_clsids).
                                  super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppfVar2
                   );
    return;
  }
  return;
}

Assistant:

xr_entity_factory::~xr_entity_factory()
{
	delete m_system_ini;
	delete_elements(m_clsids);
}